

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::DSPOMDP::Copy
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          DSPOMDP *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  int iVar1;
  pointer ppSVar2;
  undefined4 extraout_var;
  ulong uVar3;
  State *local_30;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar2) {
    uVar3 = 0;
    do {
      iVar1 = (*this->_vptr_DSPOMDP[0x16])(this,ppSVar2[uVar3]);
      local_30 = (State *)CONCAT44(extraout_var,iVar1);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
                 &local_30);
      uVar3 = uVar3 + 1;
      ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3)
            );
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> DSPOMDP::Copy(const vector<State*>& particles) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(Copy(particles[i]));
	return copy;
}